

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O0

void cmn_live_set(cmn_t *cmn,mfcc_t *vec)

{
  char *pcVar1;
  int local_1c;
  int32 i;
  mfcc_t *vec_local;
  cmn_t *cmn_local;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x38,"Update from < %s >\n",cmn->repr);
  for (local_1c = 0; local_1c < cmn->veclen; local_1c = local_1c + 1) {
    cmn->cmn_mean[local_1c] = vec[local_1c];
    cmn->sum[local_1c] = (mfcc_t)((float)vec[local_1c] * 500.0);
  }
  cmn->nframe = 500;
  pcVar1 = cmn_update_repr(cmn);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x3e,"Update to   < %s >\n",pcVar1);
  return;
}

Assistant:

void
cmn_live_set(cmn_t *cmn, mfcc_t const * vec)
{
    int32 i;

    E_INFO("Update from < %s >\n", cmn->repr);
    for (i = 0; i < cmn->veclen; i++) {
        cmn->cmn_mean[i] = vec[i];
        cmn->sum[i] = vec[i] * CMN_WIN;
    }
    cmn->nframe = CMN_WIN;
    E_INFO("Update to   < %s >\n", cmn_update_repr(cmn));
}